

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DivideTest.h
# Opt level: O0

void __thiscall
DivideTest<unsigned_long>::test_all_algorithms
          (DivideTest<unsigned_long> *this,unsigned_long denom,set_t<unsigned_long> *tested_denom)

{
  bool bVar1;
  iterator this_00;
  iterator __x;
  key_type_conflict4 *in_RDI;
  unsigned_long in_stack_00000028;
  set<unsigned_long,_std::less<unsigned_long>,_std::allocator<unsigned_long>_>
  *in_stack_ffffffffffffffb8;
  set<unsigned_long,_std::less<unsigned_long>,_std::allocator<unsigned_long>_>
  *in_stack_ffffffffffffffc8;
  
  this_00 = std::set<unsigned_long,_std::less<unsigned_long>,_std::allocator<unsigned_long>_>::end
                      (in_stack_ffffffffffffffb8);
  __x = std::set<unsigned_long,_std::less<unsigned_long>,_std::allocator<unsigned_long>_>::find
                  (in_stack_ffffffffffffffc8,in_RDI);
  bVar1 = std::operator==((_Self *)&stack0xffffffffffffffe0,(_Self *)&stack0xffffffffffffffd8);
  if (bVar1) {
    test_many<(libdivide::Branching)0>((DivideTest<unsigned_long> *)tested_denom,in_stack_00000028);
    test_many<(libdivide::Branching)1>((DivideTest<unsigned_long> *)tested_denom,in_stack_00000028);
    std::set<unsigned_long,_std::less<unsigned_long>,_std::allocator<unsigned_long>_>::insert
              ((set<unsigned_long,_std::less<unsigned_long>,_std::allocator<unsigned_long>_> *)
               this_00._M_node,(value_type_conflict6 *)__x._M_node);
  }
  return;
}

Assistant:

void test_all_algorithms(T denom, set_t<T> &tested_denom) {
#if !defined(__AVR__)
        if (tested_denom.end() == tested_denom.find(denom)) {
#endif
            PRINT_PROGRESS_MSG(F("Testing deom "));
            PRINT_PROGRESS_MSG(denom);
            PRINT_PROGRESS_MSG(F("\n"));
            test_many<BRANCHFULL>(denom);
            test_many<BRANCHFREE>(denom);
#if !defined(__AVR__)
            tested_denom.insert(denom);
        }
#else
        UNUSED(tested_denom);
#endif
    }